

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

bool __thiscall
axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::
setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>
          (Array<char,_axl::sl::ArrayDetails<char>_> *this,size_t count)

{
  size_t sVar1;
  BufHdr *pBVar2;
  ulong size;
  Hdr *pHVar3;
  bool bVar4;
  Ptr<axl::rc::BufHdr> hdr;
  Ptr<axl::rc::BufHdr> local_38;
  
  pHVar3 = (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_hdr;
  if ((pHVar3 == (Hdr *)0x0) || ((pHVar3->super_RefCount).m_refCount != 1)) {
    if (count == 0) {
      ArrayRef<char,_axl::sl::ArrayDetails<char>_>::release
                (&this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>);
      return true;
    }
    sVar1 = (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count;
  }
  else {
    sVar1 = (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count;
    if (sVar1 == count) {
      return true;
    }
    if (count <= pHVar3->m_bufferSize) {
      (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count = count;
      return true;
    }
  }
  if (sVar1 != 0) {
    sVar1 = getAllocSize<4096ul>(count);
    pBVar2 = (BufHdr *)mem::allocate(sVar1 + 0x28);
    (pBVar2->super_RefCount).m_refCount = 0;
    (pBVar2->super_RefCount).m_weakRefCount = 1;
    (pBVar2->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__RefCount_0014a0d8;
    pBVar2->m_bufferSize = sVar1;
    pBVar2->m_flags = 0;
    (pBVar2->super_RefCount).m_freeFunc = mem::deallocate;
    rc::Ptr<axl::rc::BufHdr>::Ptr<axl::rc::BufHdr>(&local_38,pBVar2);
    bVar4 = local_38.m_p != (Hdr *)0x0;
    if (bVar4) {
      pHVar3 = local_38.m_p + 1;
      size = (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count;
      if (count <= size) {
        size = count;
      }
      __wrap_memcpy(pHVar3,(this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_p,size);
      rc::RefCount::release
                (&((this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_hdr)->super_RefCount
                );
      pBVar2 = local_38.m_p;
      (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_p = (char *)pHVar3;
      local_38.m_p = (Hdr *)0x0;
      local_38.m_refCount = (RefCount *)0x0;
      (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_hdr = pBVar2;
      (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count = count;
    }
    rc::Ptr<axl::rc::BufHdr>::~Ptr(&local_38);
    return bVar4;
  }
  bVar4 = reserve(this,count);
  if (bVar4) {
    (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count = count;
    return true;
  }
  return false;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}